

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wordlist-demo.c
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  wordlist_t wordlist;
  
  wordlist_init(&wordlist);
  for (lVar1 = 1; lVar1 < argc; lVar1 = lVar1 + 1) {
    wordlist_add(&wordlist,argv[lVar1]);
  }
  wordlist_print(&wordlist);
  wordlist_delete(&wordlist);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{

    struct wordlist_t wordlist;
    wordlist_init(&wordlist);

    /* add each argument (after 0) to queue; just keep pointer */
    for (int i=1; i < argc; i++)
    {
        wordlist_add(&wordlist, argv[i]);
    }

    wordlist_print(&wordlist);
    wordlist_delete(&wordlist);
}